

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O3

shared_ptr<kratos::Var> __thiscall
kratos::EnableStmtVisitor::get_cond(EnableStmtVisitor *this,Stmt *stmt)

{
  StatementType SVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  Var *this_00;
  __node_base_ptr *pp_Var3;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *pvVar4;
  pointer this_01;
  int iVar5;
  undefined4 extraout_var;
  _Rb_tree_node_base *p_Var6;
  Expr *pEVar7;
  ulong uVar8;
  StmtException *this_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  uint64_t i;
  Var *pVVar10;
  undefined1 auVar11 [8];
  long lVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  element_type *this_03;
  element_type *peVar13;
  initializer_list<kratos::IRNode_*> __l;
  shared_ptr<kratos::Var> sVar14;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> local_88;
  Var *local_68;
  element_type *peStack_60;
  undefined1 auStack_58 [8];
  shared_ptr<kratos::Var> rest_expr;
  allocator_type local_31;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  
LAB_002150bd:
  pVVar10 = (Var *)stmt;
  iVar5 = (*(pVVar10->super_IRNode)._vptr_IRNode[4])(pVVar10);
  stmt = (Stmt *)CONCAT44(extraout_var,iVar5);
  if ((((Var *)stmt)->super_IRNode).ast_node_type_ != GeneratorKind) {
    SVar1 = *(StatementType *)&(((Var *)stmt)->name)._M_dataplus._M_p;
    if (SVar1 != Switch) goto code_r0x002150da;
    p_Var6 = (_Rb_tree_node_base *)(((Var *)stmt)->sinks_)._M_h._M_buckets;
    pp_Var3 = &(((Var *)stmt)->size_param_)._M_h._M_single_bucket;
    while( true ) {
      if (p_Var6 == (_Rb_tree_node_base *)pp_Var3) {
        this_02 = (StmtException *)__cxa_allocate_exception(0x10);
        auStack_58 = (undefined1  [8])
                     &rest_expr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)auStack_58,"Incorrect statement block stage","");
        __l._M_len = 1;
        __l._M_array = (iterator)&local_68;
        local_68 = pVVar10;
        std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                  (&local_88,__l,&local_31);
        StmtException::StmtException(this_02,(string *)auStack_58,&local_88);
        __cxa_throw(this_02,&StmtException::typeinfo,std::runtime_error::~runtime_error);
      }
      if ((Var *)p_Var6[1]._M_left == pVVar10) break;
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
    }
    pVVar10 = *(Var **)(p_Var6 + 1);
    if (pVVar10 == (Var *)0x0) {
      this_03 = (element_type *)0x0;
LAB_00215251:
      local_88.super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_88.super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      auStack_58 = (undefined1  [8])0x0;
      rest_expr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      rest_expr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::vector<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
      ::reserve((vector<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
                 *)auStack_58,(size_type)(((Var *)stmt)->sinks_)._M_h._M_before_begin._M_nxt);
      p_Var6 = (_Rb_tree_node_base *)(((Var *)stmt)->sinks_)._M_h._M_buckets;
      if (p_Var6 != (_Rb_tree_node_base *)pp_Var3) {
        do {
          if (*(long *)(p_Var6 + 1) != 0) {
            std::
            vector<std::shared_ptr<kratos::Const>,std::allocator<std::shared_ptr<kratos::Const>>>::
            emplace_back<std::shared_ptr<kratos::Const>const&>
                      ((vector<std::shared_ptr<kratos::Const>,std::allocator<std::shared_ptr<kratos::Const>>>
                        *)auStack_58,(shared_ptr<kratos::Const> *)(p_Var6 + 1));
          }
          p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
        } while (p_Var6 != (_Rb_tree_node_base *)pp_Var3);
      }
      peVar13 = rest_expr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      auVar11 = auStack_58;
      if (auStack_58 !=
          (undefined1  [8])
          rest_expr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr) {
        uVar8 = (long)rest_expr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr -
                (long)auStack_58 >> 4;
        lVar12 = 0x3f;
        if (uVar8 != 0) {
          for (; uVar8 >> lVar12 == 0; lVar12 = lVar12 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<std::shared_ptr<kratos::Const>*,std::vector<std::shared_ptr<kratos::Const>,std::allocator<std::shared_ptr<kratos::Const>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<kratos::EnableStmtVisitor::get_cond(kratos::Stmt*)::_lambda(std::shared_ptr<kratos::Const>const&,std::shared_ptr<kratos::Const>const&)_1_>>
                  (auStack_58,
                   rest_expr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                   ((uint)lVar12 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<std::shared_ptr<kratos::Const>*,std::vector<std::shared_ptr<kratos::Const>,std::allocator<std::shared_ptr<kratos::Const>>>>,__gnu_cxx::__ops::_Iter_comp_iter<kratos::EnableStmtVisitor::get_cond(kratos::Stmt*)::_lambda(std::shared_ptr<kratos::Const>const&,std::shared_ptr<kratos::Const>const&)_1_>>
                  (auVar11,peVar13);
      }
      local_88.super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>._M_impl.
      super__Vector_impl_data._M_start = *(pointer *)auStack_58;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &local_88.super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish,
                 (__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)auStack_58 + 8));
      if (0x10 < (ulong)((long)rest_expr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr - (long)auStack_58)) {
        uVar8 = 1;
        lVar12 = 0x10;
        do {
          pEVar7 = Var::operator||((Var *)local_88.
                                          super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>
                                          ._M_impl.super__Vector_impl_data._M_start,
                                   *(Var **)((long)auStack_58 + lVar12));
          std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
                    ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)&local_68,
                     (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                     &(pEVar7->super_Var).super_enable_shared_from_this<kratos::Var>);
          peVar13 = peStack_60;
          local_88.super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_68;
          this_01 = local_88.super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          local_68 = (Var *)0x0;
          peStack_60 = (element_type *)0x0;
          local_88.super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)peVar13;
          if (((element_type *)this_01 != (element_type *)0x0) &&
             (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01),
             peStack_60 != (element_type *)0x0)) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_60);
          }
          uVar8 = uVar8 + 1;
          lVar12 = lVar12 + 0x10;
        } while (uVar8 < (ulong)((long)rest_expr.
                                       super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                                       _M_ptr - (long)auStack_58 >> 4));
      }
      pVVar10 = (Var *)(((Var *)stmt)->size_param_)._M_h._M_bucket_count;
      p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               (((Var *)stmt)->size_param_)._M_h._M_before_begin._M_nxt;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        }
      }
      pEVar7 = Var::operator!=(pVVar10,(Var *)local_88.
                                              super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
      std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
                ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)&local_68,
                 (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                 &(pEVar7->super_Var).super_enable_shared_from_this<kratos::Var>);
      peVar13 = peStack_60;
      auVar11 = (undefined1  [8])local_68;
      local_68 = (Var *)0x0;
      peStack_60 = (element_type *)0x0;
      if ((this_03 != (element_type *)0x0) &&
         (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_03),
         peStack_60 != (element_type *)0x0)) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_60);
      }
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
      std::vector<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
      ::~vector((vector<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
                 *)auStack_58);
      if ((element_type *)
          local_88.super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>._M_impl.
          super__Vector_impl_data._M_finish != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_88.super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
      }
    }
    else {
      this_00 = (Var *)(((Var *)stmt)->size_param_)._M_h._M_bucket_count;
      p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               (((Var *)stmt)->size_param_)._M_h._M_before_begin._M_nxt;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          UNLOCK();
          pVVar10 = *(Var **)(p_Var6 + 1);
        }
        else {
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        }
      }
      pEVar7 = Var::eq(this_00,pVVar10);
      std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
                ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)auStack_58,
                 (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                 &(pEVar7->super_Var).super_enable_shared_from_this<kratos::Var>);
      peVar13 = rest_expr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      auVar11 = auStack_58;
      auStack_58 = (undefined1  [8])0x0;
      rest_expr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
      this_03 = peVar13;
      if (auVar11 == (undefined1  [8])0x0) goto LAB_00215251;
    }
    goto LAB_00215414;
  }
  (this->super_IRVisitor)._vptr_IRVisitor = (_func_int **)0x0;
  *(undefined8 *)&(this->super_IRVisitor).level = 0;
  _Var9._M_pi = extraout_RDX;
  goto LAB_0021546e;
code_r0x002150da:
  if (SVar1 == If) {
    if ((Var *)(((Var *)stmt)->size_param_)._M_h._M_rehash_policy._M_next_resize == pVVar10) {
      auVar11 = (undefined1  [8])(((Var *)stmt)->size_param_)._M_h._M_bucket_count;
      peVar13 = (element_type *)(((Var *)stmt)->size_param_)._M_h._M_before_begin._M_nxt;
      if (peVar13 == (element_type *)0x0) {
        peVar13 = (element_type *)0x0;
      }
      else if (__libc_single_threaded == '\0') {
        LOCK();
        pvVar4 = &(peVar13->super_IRNode).fn_name_ln;
        *(int *)&(pvVar4->
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 )._M_impl.super__Vector_impl_data._M_start =
             *(int *)&(pvVar4->
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + 1;
        UNLOCK();
      }
      else {
        pvVar4 = &(peVar13->super_IRNode).fn_name_ln;
        *(int *)&(pvVar4->
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 )._M_impl.super__Vector_impl_data._M_start =
             *(int *)&(pvVar4->
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + 1;
      }
    }
    else {
      pVVar10 = (Var *)(((Var *)stmt)->size_param_)._M_h._M_bucket_count;
      p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               (((Var *)stmt)->size_param_)._M_h._M_before_begin._M_nxt;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        }
      }
      pEVar7 = Var::r_not(pVVar10);
      std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
                ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)auStack_58,
                 (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                 &(pEVar7->super_Var).super_enable_shared_from_this<kratos::Var>);
      peVar13 = rest_expr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      auVar11 = auStack_58;
      auStack_58 = (undefined1  [8])0x0;
      rest_expr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
    }
LAB_00215414:
    sVar14 = get_cond((EnableStmtVisitor *)auStack_58,stmt);
    _Var9 = sVar14.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (auStack_58 == (undefined1  [8])0x0) {
      (this->super_IRVisitor)._vptr_IRVisitor = (_func_int **)auVar11;
      *(element_type **)&(this->super_IRVisitor).level = peVar13;
      peVar13 = (element_type *)0x0;
    }
    else {
      pEVar7 = Var::operator&&((Var *)auVar11,(Var *)auStack_58);
      std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
                ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)this,
                 (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                 &(pEVar7->super_Var).super_enable_shared_from_this<kratos::Var>);
      _Var9._M_pi = extraout_RDX_00;
    }
    if (rest_expr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 rest_expr.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      _Var9._M_pi = extraout_RDX_01;
    }
    if (peVar13 != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar13);
      _Var9._M_pi = extraout_RDX_02;
    }
LAB_0021546e:
    sVar14.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var9._M_pi;
    sVar14.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
    ;
    return (shared_ptr<kratos::Var>)
           sVar14.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>;
  }
  goto LAB_002150bd;
}

Assistant:

static std::shared_ptr<Var> get_cond(Stmt* stmt) {
        auto* ir_parent = stmt->parent();
        if (ir_parent->ir_node_kind() == IRNodeKind::GeneratorKind) {
            return nullptr;
        }
        auto* parent_stmt = reinterpret_cast<Stmt*>(ir_parent);
        std::shared_ptr<Var> expr;
        if (parent_stmt->type() == StatementType::If) {
            // need to figure out which block it belongs to
            auto* if_ = reinterpret_cast<IfStmt*>(parent_stmt);
            if (if_->then_body().get() == stmt) {
                expr = if_->predicate();
            } else {
                expr = if_->predicate()->r_not().shared_from_this();
            }
        } else if (parent_stmt->type() == StatementType::Switch) {
            auto* switch_ = reinterpret_cast<SwitchStmt*>(parent_stmt);
            // figure out which condition it is in. notice that we could be in the default
            // branch as well
            auto const& body = switch_->body();
            bool found = false;
            for (auto const& [cond, stmt_blk] : body) {
                if (stmt_blk.get() == stmt) {
                    // it's this condition
                    if (cond) expr = switch_->target()->eq(*cond).shared_from_this();
                    found = true;
                    break;
                }
            }
            if (!found) {
                throw StmtException("Incorrect statement block stage", {stmt});
            }
            if (!expr) {
                // it's the default one. we nor them together
                std::shared_ptr<Var> or_;
                std::vector<std::shared_ptr<Const>> conditions;
                conditions.reserve(body.size());
                for (auto const& [cond, stmt_blk] : body) {
                    if (cond) conditions.emplace_back(cond);
                }
                // sort conditions based on the value. it's guarantee to be unique
                // so no problems of overlap
                std::sort(
                    conditions.begin(), conditions.end(),
                    [](const std::shared_ptr<Const>& left, const std::shared_ptr<Const>& right) {
                        return left->value() < right->value();
                    });
                or_ = conditions[0];
                if (conditions.size() > 1) {
                    for (uint64_t i = 1; i < conditions.size(); i++) {
                        or_ = or_->operator||(*conditions[i]).shared_from_this();
                    }
                }
                expr = (switch_->target()->operator!=(*or_)).shared_from_this();
            }
        } else {
            return get_cond(parent_stmt);
        }
        auto rest_expr = get_cond(parent_stmt);
        if (rest_expr) {
            return expr->operator&&(*rest_expr).shared_from_this();
        } else {
            return expr;
        }
    }